

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O0

void __thiscall itis::SplayTree::insert(SplayTree *this,int x)

{
  Node *pNVar1;
  Node *new_node_1;
  Node *new_node;
  Node *curr;
  int x_local;
  SplayTree *this_local;
  
  if (this->root == (Node *)0x0) {
    pNVar1 = (Node *)operator_new(0x20);
    Node::Node(pNVar1,x);
    this->root = pNVar1;
  }
  else {
    new_node = this->root;
    while (new_node != (Node *)0x0) {
      if (x < new_node->data) {
        if (new_node->left_child == (Node *)0x0) {
          pNVar1 = (Node *)operator_new(0x20);
          Node::Node(pNVar1,x);
          new_node->left_child = pNVar1;
          pNVar1->parent = new_node;
          splay(this,pNVar1);
          this->root = pNVar1;
          return;
        }
        new_node = new_node->left_child;
      }
      else {
        if (x < new_node->data) {
          splay(this,new_node);
          return;
        }
        if (new_node->right_child == (Node *)0x0) {
          pNVar1 = (Node *)operator_new(0x20);
          Node::Node(pNVar1,x);
          new_node->right_child = pNVar1;
          pNVar1->parent = new_node;
          splay(this,pNVar1);
          this->root = pNVar1;
          return;
        }
        new_node = new_node->right_child;
      }
    }
  }
  return;
}

Assistant:

void SplayTree::insert(int x) {
    if (root == nullptr) {
      root = new Node(x);
      return;
    }
    Node *curr = this->root;
    while (curr != nullptr) {
      if (x < curr->data) {
        if (curr->left_child == nullptr) {
          Node *new_node = new Node(x);
          curr->left_child = new_node;
          new_node->parent = curr;
          splay(new_node);
          this->root = new_node;
          return;
        } else {
          curr = curr->left_child;
        }
      } else if (x >= curr->data) {
        if (curr->right_child == nullptr) {
          Node *new_node = new Node(x);
          curr->right_child = new_node;
          new_node->parent = curr;
          splay(new_node);
          this->root = new_node;
          return;
        } else {
          curr = curr->right_child;
        }
      } else {
        splay(curr);
        return;
      }
    }
  }